

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O0

void Abc_NtkWriteAig(Abc_Ntk_t *pNtk,char *pFileName)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Vec_Int_t *p;
  Abc_Obj_t *pAVar6;
  char *pcVar7;
  int local_38;
  int local_34;
  int iLit;
  int i;
  Abc_Obj_t *pObj;
  Vec_Int_t *vId2Num;
  FILE *pFile;
  char *pFileName_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcStrash.c"
                  ,0x2d3,"void Abc_NtkWriteAig(Abc_Ntk_t *, char *)");
  }
  iVar1 = Abc_NtkLatchNum(pNtk);
  if (iVar1 != 0) {
    __assert_fail("Abc_NtkLatchNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcStrash.c"
                  ,0x2d4,"void Abc_NtkWriteAig(Abc_Ntk_t *, char *)");
  }
  if (pFileName == (char *)0x0) {
    vId2Num = _stdout;
  }
  else {
    vId2Num = (Vec_Int_t *)fopen(pFileName,"w");
  }
  if (vId2Num == (Vec_Int_t *)0x0) {
    printf("Cannot open output file.\n");
  }
  else {
    iVar1 = Abc_NtkObjNumMax(pNtk);
    p = Vec_IntAlloc(iVar1 << 1);
    iVar1 = Abc_NtkObjNumMax(pNtk);
    Vec_IntFill(p,iVar1 << 1,-1);
    pAVar6 = Abc_AigConst1(pNtk);
    uVar2 = Abc_ObjId(pAVar6);
    Vec_IntWriteEntry(p,uVar2 * 2 + 1,0);
    pAVar6 = Abc_AigConst1(pNtk);
    uVar2 = Abc_ObjId(pAVar6);
    local_38 = 2;
    Vec_IntWriteEntry(p,uVar2 << 1,1);
    for (local_34 = 0; iVar1 = Abc_NtkPiNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar6 = Abc_NtkPi(pNtk,local_34);
      uVar2 = Abc_ObjId(pAVar6);
      iVar1 = local_38 + 1;
      Vec_IntWriteEntry(p,uVar2 << 1,local_38);
      uVar2 = Abc_ObjId(pAVar6);
      local_38 = local_38 + 2;
      Vec_IntWriteEntry(p,uVar2 * 2 + 1,iVar1);
    }
    for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar1; local_34 = local_34 + 1)
    {
      pAVar6 = Abc_NtkObj(pNtk,local_34);
      if ((pAVar6 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_AigNodeIsAnd(pAVar6), iVar1 != 0)) {
        uVar2 = Abc_ObjId(pAVar6);
        iVar1 = local_38 + 1;
        Vec_IntWriteEntry(p,uVar2 << 1,local_38);
        uVar2 = Abc_ObjId(pAVar6);
        local_38 = local_38 + 2;
        Vec_IntWriteEntry(p,uVar2 * 2 + 1,iVar1);
      }
    }
    fprintf((FILE *)vId2Num,"{\n");
    pcVar7 = Abc_NtkName(pNtk);
    fprintf((FILE *)vId2Num,"    \"%s\", ",pcVar7);
    uVar2 = Abc_NtkPiNum(pNtk);
    uVar3 = Abc_NtkPoNum(pNtk);
    uVar4 = Abc_NtkNodeNum(pNtk);
    fprintf((FILE *)vId2Num,"//  pi=%d  po=%d  and=%d",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
    fprintf((FILE *)vId2Num,"\n");
    fprintf((FILE *)vId2Num,"    { ");
    for (local_34 = 0; iVar1 = Abc_NtkPiNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar6 = Abc_NtkPi(pNtk,local_34);
      pcVar7 = Abc_ObjName(pAVar6);
      fprintf((FILE *)vId2Num,"\"%s\",",pcVar7);
    }
    fprintf((FILE *)vId2Num,"NULL },\n");
    fprintf((FILE *)vId2Num,"    { ");
    for (local_34 = 0; iVar1 = Abc_NtkPoNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar6 = Abc_NtkPo(pNtk,local_34);
      pcVar7 = Abc_ObjName(pAVar6);
      fprintf((FILE *)vId2Num,"\"%s\",",pcVar7);
    }
    fprintf((FILE *)vId2Num,"NULL },\n");
    fprintf((FILE *)vId2Num,"    { ");
    for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar1; local_34 = local_34 + 1)
    {
      pAVar6 = Abc_NtkObj(pNtk,local_34);
      if ((pAVar6 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_AigNodeIsAnd(pAVar6), iVar1 != 0)) {
        iVar1 = Abc_ObjFaninId0(pAVar6);
        iVar5 = Abc_ObjFaninC0(pAVar6);
        uVar2 = Vec_IntEntry(p,iVar1 * 2 + iVar5);
        fprintf((FILE *)vId2Num,"%d,",(ulong)uVar2);
      }
    }
    fprintf((FILE *)vId2Num,"0 },\n");
    fprintf((FILE *)vId2Num,"    { ");
    for (local_34 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar1; local_34 = local_34 + 1)
    {
      pAVar6 = Abc_NtkObj(pNtk,local_34);
      if ((pAVar6 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_AigNodeIsAnd(pAVar6), iVar1 != 0)) {
        iVar1 = Abc_ObjFaninId1(pAVar6);
        iVar5 = Abc_ObjFaninC1(pAVar6);
        uVar2 = Vec_IntEntry(p,iVar1 * 2 + iVar5);
        fprintf((FILE *)vId2Num,"%d,",(ulong)uVar2);
      }
    }
    fprintf((FILE *)vId2Num,"0 },\n");
    fprintf((FILE *)vId2Num,"    { ");
    for (local_34 = 0; iVar1 = Abc_NtkPoNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar6 = Abc_NtkPo(pNtk,local_34);
      iVar1 = Abc_ObjFaninId0(pAVar6);
      iVar5 = Abc_ObjFaninC0(pAVar6);
      uVar2 = Vec_IntEntry(p,iVar1 * 2 + iVar5);
      fprintf((FILE *)vId2Num,"%d,",(ulong)uVar2);
    }
    fprintf((FILE *)vId2Num,"0 },\n");
    fprintf((FILE *)vId2Num,"},\n");
    if (vId2Num != _stdout) {
      fclose((FILE *)vId2Num);
    }
    Vec_IntFree(p);
  }
  return;
}

Assistant:

void Abc_NtkWriteAig( Abc_Ntk_t * pNtk, char * pFileName )
{
    FILE * pFile;
    Vec_Int_t * vId2Num;
    Abc_Obj_t * pObj;
    int i, iLit;
    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkLatchNum(pNtk) == 0 );
    if ( pFileName == NULL )
        pFile = stdout;
    else
        pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file.\n" );
        return;
    }
    vId2Num = Vec_IntAlloc( 2*Abc_NtkObjNumMax(pNtk) );
    Vec_IntFill( vId2Num, 2*Abc_NtkObjNumMax(pNtk), -1 );

    iLit = 0;
    Vec_IntWriteEntry( vId2Num, 2*Abc_ObjId(Abc_AigConst1(pNtk))+1, iLit++ );
    Vec_IntWriteEntry( vId2Num, 2*Abc_ObjId(Abc_AigConst1(pNtk))+0, iLit++ );
    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        Vec_IntWriteEntry( vId2Num, 2*Abc_ObjId(pObj)+0, iLit++ );
        Vec_IntWriteEntry( vId2Num, 2*Abc_ObjId(pObj)+1, iLit++ );
    }
    Abc_AigForEachAnd( pNtk, pObj, i )
    {
        Vec_IntWriteEntry( vId2Num, 2*Abc_ObjId(pObj)+0, iLit++ );
        Vec_IntWriteEntry( vId2Num, 2*Abc_ObjId(pObj)+1, iLit++ );
    }
    fprintf( pFile, "{\n" );
    fprintf( pFile, "    \"%s\", ", Abc_NtkName(pNtk) );
    fprintf( pFile, "//  pi=%d  po=%d  and=%d", Abc_NtkPiNum(pNtk), Abc_NtkPoNum(pNtk), Abc_NtkNodeNum(pNtk) );
    fprintf( pFile, "\n" );
    fprintf( pFile, "    { " );
    Abc_NtkForEachPi( pNtk, pObj, i )
        fprintf( pFile, "\"%s\",", Abc_ObjName(pObj) );
    fprintf( pFile, "NULL },\n" );
    fprintf( pFile, "    { " );
    Abc_NtkForEachPo( pNtk, pObj, i )
        fprintf( pFile, "\"%s\",", Abc_ObjName(pObj) );
    fprintf( pFile, "NULL },\n" );
    fprintf( pFile, "    { " );
    Abc_AigForEachAnd( pNtk, pObj, i )
        fprintf( pFile, "%d,", Vec_IntEntry(vId2Num, 2*Abc_ObjFaninId0(pObj) + Abc_ObjFaninC0(pObj)) );
    fprintf( pFile, "0 },\n" );
    fprintf( pFile, "    { " );
    Abc_AigForEachAnd( pNtk, pObj, i )
        fprintf( pFile, "%d,", Vec_IntEntry(vId2Num, 2*Abc_ObjFaninId1(pObj) + Abc_ObjFaninC1(pObj)) );
    fprintf( pFile, "0 },\n" );
    fprintf( pFile, "    { " );
    Abc_NtkForEachPo( pNtk, pObj, i )
        fprintf( pFile, "%d,", Vec_IntEntry(vId2Num, 2*Abc_ObjFaninId0(pObj) + Abc_ObjFaninC0(pObj)) );
    fprintf( pFile, "0 },\n" );
    fprintf( pFile, "},\n" );
    if ( pFile != stdout )
        fclose( pFile );
    Vec_IntFree( vId2Num );
}